

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CoverCrossSymbol *symbol)

{
  size_t sVar1;
  bool bVar2;
  CoverageOptionSetter *option;
  CoverageOptionSetter *this_00;
  long lVar3;
  
  bVar2 = handleDefault<slang::ast::CoverCrossSymbol>(this,symbol);
  if (bVar2) {
    CoverCrossSymbol::getIffExpr(symbol);
    sVar1 = (symbol->options)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      this_00 = (symbol->options)._M_ptr;
      lVar3 = sVar1 * 0x18;
      do {
        CoverageOptionSetter::getExpression(this_00);
        this_00 = this_00 + 1;
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
  }
  return;
}

Assistant:

void handle(const CoverCrossSymbol& symbol) {
        if (!handleDefault(symbol))
            return;

        symbol.getIffExpr();
        for (auto& option : symbol.options)
            option.getExpression();
    }